

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any.cpp
# Opt level: O0

bool __thiscall big_type::check(big_type *this)

{
  long lVar1;
  char *pcVar2;
  big_type *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 300) {
    fprintf(_stdout,"Failed at %d:%s: %s\n",0x23,
            "/workspace/llm4binary/github/license_c_cmakelists/thelink2012[P]any/test_any.cpp",
            "value.size() == 300");
    exit(1);
  }
  pcVar2 = (char *)std::__cxx11::string::front();
  if (*pcVar2 == 'b') {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == 'b') {
      if ((this->i_wanna_be_big[0] == 'k') && (this->i_wanna_be_big[0x32] == 'k')) {
        return true;
      }
      fprintf(_stdout,"Failed at %d:%s: %s\n",0x25,
              "/workspace/llm4binary/github/license_c_cmakelists/thelink2012[P]any/test_any.cpp",
              "i_wanna_be_big[0] == \'k\' && i_wanna_be_big[50] == \'k\'");
      exit(1);
    }
  }
  fprintf(_stdout,"Failed at %d:%s: %s\n",0x24,
          "/workspace/llm4binary/github/license_c_cmakelists/thelink2012[P]any/test_any.cpp",
          "value.front() == \'b\' && value.back() == \'b\'");
  exit(1);
}

Assistant:

bool check()
    {
        CHECK(value.size() == 300);
        CHECK(value.front() == 'b' && value.back() == 'b');
        CHECK(i_wanna_be_big[0] == 'k' && i_wanna_be_big[50] == 'k');
        return true;
    }